

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereRangeVectorLen(Parse *pParse,int iCur,Index *pIdx,int nEq,WhereTerm *pTerm)

{
  Expr *pEVar1;
  Expr *pExpr;
  char cVar2;
  int iVar3;
  int iVar4;
  Select *pSVar5;
  CollSeq *pCVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  iVar3 = sqlite3ExprVectorSize(pTerm->pExpr->pLeft);
  iVar8 = (uint)pIdx->nColumn - nEq;
  if (iVar3 < iVar8) {
    iVar8 = iVar3;
  }
  iVar3 = 1;
  if (1 < iVar8) {
    iVar3 = iVar8;
  }
  lVar10 = 1;
  lVar9 = 0x28;
  while( true ) {
    if (iVar8 <= lVar10) {
      return iVar3;
    }
    pEVar1 = pTerm->pExpr->pRight;
    pSVar5 = (Select *)&pEVar1->x;
    if ((pEVar1->flags & 0x800) != 0) {
      pSVar5 = *(Select **)pSVar5;
    }
    pEVar1 = *(Expr **)((long)((pTerm->pExpr->pLeft->x).pList)->a + lVar9 + -8);
    if ((((pEVar1->op != 0x98) || (pEVar1->iTable != iCur)) ||
        (pEVar1->iColumn != pIdx->aiColumn[nEq + lVar10])) ||
       (pIdx->aSortOrder[lVar10 + nEq] != pIdx->aSortOrder[(uint)nEq])) break;
    pExpr = *(Expr **)((long)((anon_union_8_2_a01b6dbf_for_x *)&pSVar5->pEList)->pList->a +
                      lVar9 + -8);
    cVar2 = sqlite3ExprAffinity(pEVar1);
    cVar2 = sqlite3CompareAffinity(pExpr,cVar2);
    if ((long)pEVar1->iColumn < 0) {
      cVar7 = 'D';
    }
    else {
      cVar7 = pIdx->pTable->aCol[pEVar1->iColumn].affinity;
    }
    if (((cVar2 != cVar7) ||
        (pCVar6 = sqlite3BinaryCompareCollSeq(pParse,pEVar1,pExpr), pCVar6 == (CollSeq *)0x0)) ||
       (iVar4 = sqlite3StrICmp(pCVar6->zName,pIdx->azColl[nEq + lVar10]), iVar4 != 0)) break;
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 0x20;
  }
  return (int)lVar10;
}

Assistant:

static int whereRangeVectorLen(
  Parse *pParse,       /* Parsing context */
  int iCur,            /* Cursor open on pIdx */
  Index *pIdx,         /* The index to be used for a inequality constraint */
  int nEq,             /* Number of prior equality constraints on same index */
  WhereTerm *pTerm     /* The vector inequality constraint */
){
  int nCmp = sqlite3ExprVectorSize(pTerm->pExpr->pLeft);
  int i;

  nCmp = MIN(nCmp, (pIdx->nColumn - nEq));
  for(i=1; i<nCmp; i++){
    /* Test if comparison i of pTerm is compatible with column (i+nEq) 
    ** of the index. If not, exit the loop.  */
    char aff;                     /* Comparison affinity */
    char idxaff = 0;              /* Indexed columns affinity */
    CollSeq *pColl;               /* Comparison collation sequence */
    Expr *pLhs = pTerm->pExpr->pLeft->x.pList->a[i].pExpr;
    Expr *pRhs = pTerm->pExpr->pRight;
    if( pRhs->flags & EP_xIsSelect ){
      pRhs = pRhs->x.pSelect->pEList->a[i].pExpr;
    }else{
      pRhs = pRhs->x.pList->a[i].pExpr;
    }

    /* Check that the LHS of the comparison is a column reference to
    ** the right column of the right source table. And that the sort
    ** order of the index column is the same as the sort order of the
    ** leftmost index column.  */
    if( pLhs->op!=TK_COLUMN 
     || pLhs->iTable!=iCur 
     || pLhs->iColumn!=pIdx->aiColumn[i+nEq] 
     || pIdx->aSortOrder[i+nEq]!=pIdx->aSortOrder[nEq]
    ){
      break;
    }

    testcase( pLhs->iColumn==XN_ROWID );
    aff = sqlite3CompareAffinity(pRhs, sqlite3ExprAffinity(pLhs));
    idxaff = sqlite3TableColumnAffinity(pIdx->pTable, pLhs->iColumn);
    if( aff!=idxaff ) break;

    pColl = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
    if( pColl==0 ) break;
    if( sqlite3StrICmp(pColl->zName, pIdx->azColl[i+nEq]) ) break;
  }
  return i;
}